

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjExporter.cpp
# Opt level: O0

void __thiscall
Assimp::ObjExporter::ObjExporter(ObjExporter *this,char *_filename,aiScene *pScene,bool noMtl)

{
  aiScene *__s;
  locale local_58 [8];
  locale local_50 [8];
  locale local_48 [8];
  locale *local_40;
  locale *l;
  byte local_21;
  aiScene *paStack_20;
  bool noMtl_local;
  aiScene *pScene_local;
  char *_filename_local;
  ObjExporter *this_local;
  
  local_21 = noMtl;
  paStack_20 = pScene;
  pScene_local = (aiScene *)_filename;
  _filename_local = (char *)this;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)this);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&this->mOutputMat);
  __s = pScene_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->filename,(char *)__s,(allocator<char> *)((long)&l + 3));
  std::allocator<char>::~allocator((allocator<char> *)((long)&l + 3));
  this->pScene = paStack_20;
  (this->vn).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->vn).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->vn).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::vector(&this->vn);
  (this->vt).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->vt).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->vt).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::vector(&this->vt);
  std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::vector(&this->vc);
  (this->vp).
  super__Vector_base<Assimp::ObjExporter::vertexData,_std::allocator<Assimp::ObjExporter::vertexData>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->vp).
  super__Vector_base<Assimp::ObjExporter::vertexData,_std::allocator<Assimp::ObjExporter::vertexData>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->vp).
  super__Vector_base<Assimp::ObjExporter::vertexData,_std::allocator<Assimp::ObjExporter::vertexData>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<Assimp::ObjExporter::vertexData,_std::allocator<Assimp::ObjExporter::vertexData>_>::
  vector(&this->vp);
  this->useVc = false;
  indexMap<aiVector3t<float>,_Assimp::ObjExporter::aiVectorCompare>::indexMap(&this->mVnMap);
  indexMap<aiVector3t<float>,_Assimp::ObjExporter::aiVectorCompare>::indexMap(&this->mVtMap);
  indexMap<Assimp::ObjExporter::vertexData,_Assimp::ObjExporter::vertexDataCompare>::indexMap
            (&this->mVpMap);
  (this->mMeshes).
  super__Vector_base<Assimp::ObjExporter::MeshInstance,_std::allocator<Assimp::ObjExporter::MeshInstance>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mMeshes).
  super__Vector_base<Assimp::ObjExporter::MeshInstance,_std::allocator<Assimp::ObjExporter::MeshInstance>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mMeshes).
  super__Vector_base<Assimp::ObjExporter::MeshInstance,_std::allocator<Assimp::ObjExporter::MeshInstance>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<Assimp::ObjExporter::MeshInstance,_std::allocator<Assimp::ObjExporter::MeshInstance>_>
  ::vector(&this->mMeshes);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->endl,"\n",(allocator<char> *)((long)&l + 2));
  std::allocator<char>::~allocator((allocator<char> *)((long)&l + 2));
  std::locale::locale(local_48,"C");
  local_40 = local_48;
  std::ios::imbue(local_50);
  std::locale::~locale(local_50);
  std::ios_base::precision((ios_base *)(&this->mOutput + *(long *)(*(long *)this + -0x18)),8);
  std::ios::imbue(local_58);
  std::locale::~locale(local_58);
  std::ios_base::precision
            ((ios_base *)(&this->mOutputMat + *(long *)(*(long *)&this->mOutputMat + -0x18)),8);
  WriteGeometryFile(this,(bool)(local_21 & 1));
  if ((local_21 & 1) == 0) {
    WriteMaterialFile(this);
  }
  std::locale::~locale(local_48);
  return;
}

Assistant:

ObjExporter::ObjExporter(const char* _filename, const aiScene* pScene, bool noMtl)
: filename(_filename)
, pScene(pScene)
, vn()
, vt()
, vp()
, useVc(false)
, mVnMap()
, mVtMap()
, mVpMap()
, mMeshes()
, endl("\n") {
    // make sure that all formatting happens using the standard, C locale and not the user's current locale
    const std::locale& l = std::locale("C");
    mOutput.imbue(l);
    mOutput.precision(ASSIMP_AI_REAL_TEXT_PRECISION);
    mOutputMat.imbue(l);
    mOutputMat.precision(ASSIMP_AI_REAL_TEXT_PRECISION);

    WriteGeometryFile(noMtl);
    if ( !noMtl ) {
        WriteMaterialFile();
    }
}